

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplevm.cpp
# Opt level: O0

void __thiscall BrainFuckVM::BrainFuckVM(BrainFuckVM *this,int32_t *program,size_t sz)

{
  undefined1 auVar1 [16];
  uint8_t *puVar2;
  ulong uVar3;
  int32_t *piVar4;
  size_t sz_local;
  int32_t *program_local;
  BrainFuckVM *this_local;
  
  puVar2 = (uint8_t *)operator_new__(30000);
  this->tape_ = puVar2;
  this->data_ptr_ = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sz;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  piVar4 = (int32_t *)operator_new__(uVar3);
  this->program_ = piVar4;
  this->instructions_ = (int)(sz >> 1);
  this->pc_ = 0;
  memset(this->tape_,0,30000);
  memcpy(this->program_,program,sz << 2);
  return;
}

Assistant:

BrainFuckVM(int32_t *program, size_t sz) :
            tape_(new uint8_t[TAPE_SIZE]),
            data_ptr_(0),
            program_(new int32_t[sz]),
            pc_(0),
            instructions_(sz / 2)
    {
        memset(tape_, 0, TAPE_SIZE);
        memcpy(program_, program, sizeof(int32_t) * sz);
    }